

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SilentEntitySystem::~SilentEntitySystem(SilentEntitySystem *this)

{
  SilentEntitySystem *this_local;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SilentEntitySystem_003309c8;
  std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  ::clear(&this->m_vEA);
  std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  ::~vector(&this->m_vEA);
  EntityType::~EntityType(&this->m_EntTyp);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

SilentEntitySystem::~SilentEntitySystem()
{
    m_vEA.clear();
}